

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O0

run_container_t * run_container_create_given_capacity(int32_t size)

{
  rle16_t *prVar1;
  int in_EDI;
  run_container_t *run;
  run_container_t *local_8;
  
  local_8 = (run_container_t *)roaring_malloc(0x1534a2);
  if (local_8 == (run_container_t *)0x0) {
    local_8 = (run_container_t *)0x0;
  }
  else {
    if (in_EDI < 1) {
      local_8->runs = (rle16_t *)0x0;
    }
    else {
      prVar1 = (rle16_t *)roaring_malloc(0x1534da);
      local_8->runs = prVar1;
      if (prVar1 == (rle16_t *)0x0) {
        roaring_free((void *)0x1534f1);
        return (run_container_t *)0x0;
      }
    }
    local_8->capacity = in_EDI;
    local_8->n_runs = 0;
  }
  return local_8;
}

Assistant:

run_container_t *run_container_create_given_capacity(int32_t size) {
    run_container_t *run;
    /* Allocate the run container itself. */
    if ((run = (run_container_t *)roaring_malloc(sizeof(run_container_t))) ==
        NULL) {
        return NULL;
    }
    if (size <= 0) {  // we don't want to rely on malloc(0)
        run->runs = NULL;
    } else if ((run->runs = (rle16_t *)roaring_malloc(sizeof(rle16_t) *
                                                      size)) == NULL) {
        roaring_free(run);
        return NULL;
    }
    run->capacity = size;
    run->n_runs = 0;
    return run;
}